

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O3

void idct64_low1_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  __m256i alVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  
  iVar4 = 1 << ((char)bit - 1U & 0x1f);
  iVar5 = bd + (uint)(do_cols == 0) * 2;
  iVar3 = 0x8000;
  if (0xf < iVar5 + 6) {
    iVar3 = 1 << ((char)iVar5 + 5U & 0x1f);
  }
  auVar6._4_4_ = iVar4;
  auVar6._0_4_ = iVar4;
  auVar6._8_4_ = iVar4;
  auVar6._12_4_ = iVar4;
  auVar6._16_4_ = iVar4;
  auVar6._20_4_ = iVar4;
  auVar6._24_4_ = iVar4;
  auVar6._28_4_ = iVar4;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + (long)bit * 0x100 + 0x1e0);
  auVar8._4_4_ = uVar1;
  auVar8._0_4_ = uVar1;
  auVar8._8_4_ = uVar1;
  auVar8._12_4_ = uVar1;
  auVar8._16_4_ = uVar1;
  auVar8._20_4_ = uVar1;
  auVar8._24_4_ = uVar1;
  auVar8._28_4_ = uVar1;
  auVar8 = vpmulld_avx2(auVar8,(undefined1  [32])*in);
  auVar8 = vpaddd_avx2(auVar8,auVar6);
  auVar8 = vpsrad_avx2(auVar8,ZEXT416((uint)bit));
  if (do_cols == 0) {
    iVar3 = 10;
    if (10 < bd) {
      iVar3 = bd;
    }
    iVar3 = 0x20 << ((byte)iVar3 & 0x1f);
    iVar4 = -iVar3;
    auVar7._4_4_ = iVar4;
    auVar7._0_4_ = iVar4;
    auVar7._8_4_ = iVar4;
    auVar7._12_4_ = iVar4;
    auVar7._16_4_ = iVar4;
    auVar7._20_4_ = iVar4;
    auVar7._24_4_ = iVar4;
    auVar7._28_4_ = iVar4;
    iVar3 = iVar3 + -1;
    auVar9._4_4_ = iVar3;
    auVar9._0_4_ = iVar3;
    auVar9._8_4_ = iVar3;
    auVar9._12_4_ = iVar3;
    auVar9._16_4_ = iVar3;
    auVar9._20_4_ = iVar3;
    auVar9._24_4_ = iVar3;
    auVar9._28_4_ = iVar3;
    if (out_shift != 0) {
      iVar3 = (1 << ((byte)out_shift & 0x1f)) >> 1;
      auVar10._4_4_ = iVar3;
      auVar10._0_4_ = iVar3;
      auVar10._8_4_ = iVar3;
      auVar10._12_4_ = iVar3;
      auVar10._16_4_ = iVar3;
      auVar10._20_4_ = iVar3;
      auVar10._24_4_ = iVar3;
      auVar10._28_4_ = iVar3;
      auVar8 = vpaddd_avx2(auVar8,auVar10);
      auVar8 = vpsrad_avx2(auVar8,ZEXT416((uint)out_shift));
    }
  }
  else {
    iVar4 = -iVar3;
    iVar3 = iVar3 + -1;
    auVar7._4_4_ = iVar4;
    auVar7._0_4_ = iVar4;
    auVar7._8_4_ = iVar4;
    auVar7._12_4_ = iVar4;
    auVar7._16_4_ = iVar4;
    auVar7._20_4_ = iVar4;
    auVar7._24_4_ = iVar4;
    auVar7._28_4_ = iVar4;
    auVar9._4_4_ = iVar3;
    auVar9._0_4_ = iVar3;
    auVar9._8_4_ = iVar3;
    auVar9._12_4_ = iVar3;
    auVar9._16_4_ = iVar3;
    auVar9._20_4_ = iVar3;
    auVar9._24_4_ = iVar3;
    auVar9._28_4_ = iVar3;
  }
  auVar8 = vpmaxsd_avx2(auVar8,auVar7);
  alVar2 = (__m256i)vpminsd_avx2(auVar8,auVar9);
  *out = alVar2;
  out[1] = alVar2;
  out[2] = alVar2;
  out[3] = alVar2;
  out[4] = alVar2;
  out[5] = alVar2;
  out[6] = alVar2;
  out[7] = alVar2;
  out[8] = alVar2;
  out[9] = alVar2;
  out[10] = alVar2;
  out[0xb] = alVar2;
  out[0xc] = alVar2;
  out[0xd] = alVar2;
  out[0xe] = alVar2;
  out[0xf] = alVar2;
  out[0x10] = alVar2;
  out[0x11] = alVar2;
  out[0x12] = alVar2;
  out[0x13] = alVar2;
  out[0x14] = alVar2;
  out[0x15] = alVar2;
  out[0x16] = alVar2;
  out[0x17] = alVar2;
  out[0x18] = alVar2;
  out[0x19] = alVar2;
  out[0x1a] = alVar2;
  out[0x1b] = alVar2;
  out[0x1c] = alVar2;
  out[0x1d] = alVar2;
  out[0x1e] = alVar2;
  out[0x1f] = alVar2;
  out[0x20] = alVar2;
  out[0x21] = alVar2;
  out[0x22] = alVar2;
  out[0x23] = alVar2;
  out[0x24] = alVar2;
  out[0x25] = alVar2;
  out[0x26] = alVar2;
  out[0x27] = alVar2;
  out[0x28] = alVar2;
  out[0x29] = alVar2;
  out[0x2a] = alVar2;
  out[0x2b] = alVar2;
  out[0x2c] = alVar2;
  out[0x2d] = alVar2;
  out[0x2e] = alVar2;
  out[0x2f] = alVar2;
  out[0x30] = alVar2;
  out[0x31] = alVar2;
  out[0x32] = alVar2;
  out[0x33] = alVar2;
  out[0x34] = alVar2;
  out[0x35] = alVar2;
  out[0x36] = alVar2;
  out[0x37] = alVar2;
  out[0x38] = alVar2;
  out[0x39] = alVar2;
  out[0x3a] = alVar2;
  out[0x3b] = alVar2;
  out[0x3c] = alVar2;
  out[0x3d] = alVar2;
  out[0x3e] = alVar2;
  out[0x3f] = alVar2;
  return;
}

Assistant:

static void idct64_low1_avx2(const __m256i *input, __m256i *output) {
  const int32_t *cospi = cospi_arr(INV_COS_BIT);

  // stage 1
  __m256i x[32];
  x[0] = input[0];

  // stage 2
  // stage 3
  // stage 4
  // stage 5
  // stage 6
  btf_16_w16_0_avx2(cospi[32], cospi[32], x[0], x[0], x[1]);

  // stage 7
  // stage 8
  // stage 9
  // stage 10
  // stage 11
  output[0] = x[0];
  output[63] = x[0];
  output[1] = x[1];
  output[62] = x[1];
  output[2] = x[1];
  output[61] = x[1];
  output[3] = x[0];
  output[60] = x[0];
  output[4] = x[0];
  output[59] = x[0];
  output[5] = x[1];
  output[58] = x[1];
  output[6] = x[1];
  output[57] = x[1];
  output[7] = x[0];
  output[56] = x[0];
  output[8] = x[0];
  output[55] = x[0];
  output[9] = x[1];
  output[54] = x[1];
  output[10] = x[1];
  output[53] = x[1];
  output[11] = x[0];
  output[52] = x[0];
  output[12] = x[0];
  output[51] = x[0];
  output[13] = x[1];
  output[50] = x[1];
  output[14] = x[1];
  output[49] = x[1];
  output[15] = x[0];
  output[48] = x[0];
  output[16] = x[0];
  output[47] = x[0];
  output[17] = x[1];
  output[46] = x[1];
  output[18] = x[1];
  output[45] = x[1];
  output[19] = x[0];
  output[44] = x[0];
  output[20] = x[0];
  output[43] = x[0];
  output[21] = x[1];
  output[42] = x[1];
  output[22] = x[1];
  output[41] = x[1];
  output[23] = x[0];
  output[40] = x[0];
  output[24] = x[0];
  output[39] = x[0];
  output[25] = x[1];
  output[38] = x[1];
  output[26] = x[1];
  output[37] = x[1];
  output[27] = x[0];
  output[36] = x[0];
  output[28] = x[0];
  output[35] = x[0];
  output[29] = x[1];
  output[34] = x[1];
  output[30] = x[1];
  output[33] = x[1];
  output[31] = x[0];
  output[32] = x[0];
}